

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

string * google::protobuf::compiler::ruby::RubifyConstant
                   (string *__return_storage_ptr__,string *name)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_19;
  string *local_18;
  string *name_local;
  string *ret;
  
  local_19 = 0;
  local_18 = name;
  name_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    bVar1 = IsLower(*pcVar4);
    if (bVar1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      cVar2 = ToUpper(*pcVar4);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *pcVar4 = cVar2;
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      bVar1 = IsAlpha(*pcVar4);
      if (!bVar1) {
        std::operator+(&local_50,"PB_",__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RubifyConstant(const std::string& name) {
  std::string ret = name;
  if (!ret.empty()) {
    if (IsLower(ret[0])) {
      // If it starts with a lowercase letter, capitalize it.
      ret[0] = ToUpper(ret[0]);
    } else if (!IsAlpha(ret[0])) {
      // Otherwise (e.g. if it begins with an underscore), we need to come up
      // with some prefix that starts with a capital letter. We could be smarter
      // here, e.g. try to strip leading underscores, but this may cause other
      // problems if the user really intended the name. So let's just prepend a
      // well-known suffix.
      ret = "PB_" + ret;
    }
  }

  return ret;
}